

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

int get_attr(attr_list list,int index,atom_t *name,attr_value_type *val_type,attr_value *value)

{
  short sVar1;
  attr_list *pp_Var2;
  int_attr_struct *piVar3;
  int iVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  
  sVar1 = list->list_of_lists;
  while( true ) {
    if (sVar1 == 0) {
      piVar3 = (list->l).list.iattrs;
      if (index < (int)(uint)piVar3->int_attr_count) {
        *name = piVar3->iattr[index].attr_id;
        *val_type = Attr_Int4;
        dVar5 = (double)(long)((list->l).list.iattrs)->iattr[index].value;
      }
      else {
        lVar6 = (long)index - (ulong)piVar3->int_attr_count;
        if ((int)(uint)piVar3->other_attr_count <= (int)lVar6) {
          return 0;
        }
        *name = (list->l).list.attributes[lVar6].attr_id;
        *val_type = (list->l).list.attributes[lVar6].val_type;
        dVar5 = (list->l).list.attributes[lVar6].value.u.d;
      }
      *value = (attr_value)dVar5;
      return 1;
    }
    lVar6 = (long)(list->l).lists.sublist_count;
    if (lVar6 < 1) break;
    pp_Var2 = (list->l).lists.lists;
    lVar7 = 0;
    while( true ) {
      list = pp_Var2[lVar7];
      iVar4 = attr_count(list);
      if (index < iVar4) break;
      lVar7 = lVar7 + 1;
      index = index - iVar4;
      if (lVar6 == lVar7) {
        return 0;
      }
    }
    sVar1 = list->list_of_lists;
  }
  return 0;
}

Assistant:

int
get_attr(attr_list list,int index, atom_t *name,
	  attr_value_type *val_type, attr_value *value)
{
    if (!list->list_of_lists) {
	if (index < list->l.list.iattrs->int_attr_count) {
	    *name = list->l.list.iattrs->iattr[index].attr_id;
	    *val_type = Attr_Int4;
	    *value = (attr_value) (long) list->l.list.iattrs->iattr[index].value;
	    return 1;
	}
	index -= list->l.list.iattrs->int_attr_count;
	if (index < list->l.list.iattrs->other_attr_count) {
	    *name = list->l.list.attributes[index].attr_id;
	    *val_type = list->l.list.attributes[index].val_type;
	    *value = (int64_t)list->l.list.attributes[index].value.u.l;
	    return 1;
	}
	return 0;
    } else {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            int count = attr_count(list->l.lists.lists[i]);
            if (index < count) {
                return get_attr(list->l.lists.lists[i], index, name, 
				val_type, value);
            } else {
                index -= count;
            }
        }
        return 0;
    }   
}